

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

bool IsLibraryFunction(ParseNode *expr,ScriptContext *scriptContext)

{
  ParseNode *this;
  ParseNode *this_00;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  PropertyId PVar4;
  ParseNodeBin *pPVar5;
  Symbol *pSVar6;
  ParseNodeName *pPVar7;
  
  if ((expr != (ParseNode *)0x0) && (expr->nop == knopDot)) {
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    this = pPVar5->pnode1;
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    this_00 = pPVar5->pnode2;
    pSVar6 = (Symbol *)(ulong)(this != (ParseNode *)0x0);
    bVar1 = true;
    if ((this_00 != (ParseNode *)0x0 && this != (ParseNode *)0x0) &&
       ((this->nop == knopName && (this_00->nop == knopName)))) {
      pPVar7 = ParseNode::AsParseNodeName(this);
      pSVar6 = pPVar7->sym;
      if ((pSVar6 == (Symbol *)0x0) || ((pSVar6->field_0x42 & 8) != 0)) {
        pPVar7 = ParseNode::AsParseNodeName(this);
        uVar3 = ParseNodeName::PropertyIdFromNameNode(pPVar7);
        pSVar6 = (Symbol *)(ulong)uVar3;
        if (uVar3 == 0xd7) {
          pPVar7 = ParseNode::AsParseNodeName(this_00);
          PVar4 = ParseNodeName::PropertyIdFromNameNode(pPVar7);
          pSVar6 = (Symbol *)(ulong)(PVar4 - 0x1dU < 0x26);
          bVar1 = false;
        }
      }
    }
    bVar2 = (byte)pSVar6;
    if (!bVar1) goto LAB_0083777c;
  }
  bVar2 = 0;
LAB_0083777c:
  return (bool)(bVar2 & 1);
}

Assistant:

bool IsLibraryFunction(ParseNode* expr, Js::ScriptContext* scriptContext)
{
    if (expr && expr->nop == knopDot)
    {
        ParseNode* lhs = expr->AsParseNodeBin()->pnode1;
        ParseNode* rhs = expr->AsParseNodeBin()->pnode2;
        if ((lhs != nullptr) && (rhs != nullptr) && (lhs->nop == knopName) && (rhs->nop == knopName))
        {
            Symbol* lsym = lhs->AsParseNodeName()->sym;
            if ((lsym == nullptr || lsym->GetIsGlobal()) && lhs->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::Math)
            {
                return IsMathLibraryId(rhs->AsParseNodeName()->PropertyIdFromNameNode());
            }
        }
    }
    return false;
}